

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallTargetGenerator::AddInstallNamePatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  cmMakefile *this_00;
  string *psVar6;
  cmComputeLinkInformation *this_01;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  _Alloc_hider _Var11;
  Indent IVar12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string fname;
  string new_id;
  string for_build;
  string installNameTool;
  string for_install_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  install_name_remap;
  int local_164;
  string local_158;
  string local_138;
  string local_118;
  pointer local_f8;
  string *local_f0;
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  string local_c8;
  string *local_a8;
  string local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  string local_50;
  
  if (((this->ImportLibrary == false) && (this->NamelinkMode != NamelinkModeOnly)) &&
     ((local_a8 = toDestDirPath, TVar4 = cmGeneratorTarget::GetType(this->Target),
      TVar4 == SHARED_LIBRARY ||
      ((TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == MODULE_LIBRARY ||
       (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 == EXECUTABLE)))))) {
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"CMAKE_INSTALL_NAME_TOOL","");
    psVar6 = cmMakefile::GetSafeDefinition(this_00,&local_118);
    local_e8 = local_d8;
    pcVar1 = (psVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar1,pcVar1 + psVar6->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 != 0) {
      local_80._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_80._M_impl.super__Rb_tree_header._M_header;
      local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_80._M_impl.super__Rb_tree_header._M_header._M_right =
           local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      this_01 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
      if (this_01 != (cmComputeLinkInformation *)0x0) {
        psVar7 = cmComputeLinkInformation::GetSharedLibrariesLinked(this_01);
        for (p_Var9 = (psVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != &(psVar7->_M_t)._M_impl.super__Rb_tree_header;
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          pcVar2 = *(cmGeneratorTarget **)(p_Var9 + 1);
          bVar3 = cmGeneratorTarget::IsImported(pcVar2);
          if (!bVar3) {
            cmGeneratorTarget::GetInstallNameDirForBuildTree(&local_118,pcVar2,config);
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_158,"${CMAKE_INSTALL_PREFIX}","");
            cmGeneratorTarget::GetInstallNameDirForInstallTree(&local_138,pcVar2,config,&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            _Var11._M_p = local_138._M_dataplus._M_p;
            if ((local_118._M_string_length != local_138._M_string_length) ||
               (((pointer)local_118._M_string_length != (pointer)0x0 &&
                (iVar5 = bcmp(local_118._M_dataplus._M_p,local_138._M_dataplus._M_p,
                              local_118._M_string_length), iVar5 != 0)))) {
              GetInstallFilename(&local_158,pcVar2,config,NameSO);
              std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_158._M_dataplus._M_p);
              std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_158._M_dataplus._M_p);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_80,&local_118);
              std::__cxx11::string::_M_assign((string *)pmVar8);
              _Var11._M_p = local_138._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
                _Var11._M_p = local_138._M_dataplus._M_p;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var11._M_p != &local_138.field_2) {
              operator_delete(_Var11._M_p,
                              CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                       local_138.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
      TVar4 = cmGeneratorTarget::GetType(this->Target);
      if (TVar4 == SHARED_LIBRARY) {
        cmGeneratorTarget::GetInstallNameDirForBuildTree(&local_158,this->Target,config);
        pcVar2 = this->Target;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"${CMAKE_INSTALL_PREFIX}","");
        cmGeneratorTarget::GetInstallNameDirForInstallTree(&local_c8,pcVar2,config,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        cmGeneratorTarget::IsFrameworkOnApple(this->Target);
        _Var11._M_p = local_c8._M_dataplus._M_p;
        if ((local_158._M_string_length != local_c8._M_string_length) ||
           (((undefined1 *)local_158._M_string_length != (undefined1 *)0x0 &&
            (iVar5 = bcmp(local_158._M_dataplus._M_p,local_c8._M_dataplus._M_p,
                          local_158._M_string_length), iVar5 != 0)))) {
          GetInstallFilename(&local_a0,this->Target,config,NameSO);
          local_118._M_dataplus._M_p = (pointer)local_c8._M_string_length;
          local_118._M_string_length = (size_type)local_c8._M_dataplus._M_p;
          local_118.field_2._M_allocated_capacity = 0;
          local_118.field_2._8_8_ = local_a0._M_string_length;
          local_f8 = local_a0._M_dataplus._M_p;
          views._M_len = 2;
          views._M_array = (iterator)&local_118;
          local_f0 = &local_a0;
          cmCatViews(&local_50,views);
          std::__cxx11::string::operator=((string *)&local_138,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          _Var11._M_p = local_c8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            _Var11._M_p = local_c8._M_dataplus._M_p;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var11._M_p != &local_c8.field_2) {
          operator_delete(_Var11._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_80._M_impl.super__Rb_tree_header._M_node_count != 0 ||
          (pointer)local_138._M_string_length != (pointer)0x0) {
        IVar12.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar12.Level = IVar12.Level + -1;
          } while (IVar12.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"execute_process(COMMAND \"",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_e8,local_e0);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        if ((pointer)local_138._M_string_length != (pointer)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          IVar12.Level = indent.Level;
          if (0 < indent.Level) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              IVar12.Level = IVar12.Level + -1;
            } while (IVar12.Level != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"  -id \"",7);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (os,local_138._M_dataplus._M_p,local_138._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
        }
        p_Var9 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_80._M_impl.super__Rb_tree_header) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
            IVar12.Level = indent.Level;
            if (0 < indent.Level) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                IVar12.Level = IVar12.Level + -1;
              } while (IVar12.Level != 0);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"  -change \"",0xb);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (os,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" \"",3);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,*(char **)(p_Var9 + 2),(long)p_Var9[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != &local_80._M_impl.super__Rb_tree_header);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        local_164 = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            local_164 = local_164 + -1;
          } while (local_164 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  \"",3);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (os,(local_a8->_M_dataplus)._M_p,local_a8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n",3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                 local_138.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_80);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddInstallNamePatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  if (this->ImportLibrary || this->NamelinkMode == NamelinkModeOnly ||
      !(this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::EXECUTABLE)) {
    return;
  }

  // Fix the install_name settings in installed binaries.
  std::string installNameTool =
    this->Target->Target->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  if (installNameTool.empty()) {
    return;
  }

  // Build a map of build-tree install_name to install-tree install_name for
  // shared libraries linked to this target.
  std::map<std::string, std::string> install_name_remap;
  if (cmComputeLinkInformation* cli =
        this->Target->GetLinkInformation(config)) {
    std::set<cmGeneratorTarget const*> const& sharedLibs =
      cli->GetSharedLibrariesLinked();
    for (cmGeneratorTarget const* tgt : sharedLibs) {
      // The install_name of an imported target does not change.
      if (tgt->IsImported()) {
        continue;
      }

      // If the build tree and install tree use different path
      // components of the install_name field then we need to create a
      // mapping to be applied after installation.
      std::string for_build = tgt->GetInstallNameDirForBuildTree(config);
      std::string for_install = tgt->GetInstallNameDirForInstallTree(
        config, "${CMAKE_INSTALL_PREFIX}");
      if (for_build != for_install) {
        // The directory portions differ.  Append the filename to
        // create the mapping.
        std::string fname = this->GetInstallFilename(tgt, config, NameSO);

        // Map from the build-tree install_name.
        for_build += fname;

        // Map to the install-tree install_name.
        for_install += fname;

        // Store the mapping entry.
        install_name_remap[for_build] = for_install;
      }
    }
  }

  // Edit the install_name of the target itself if necessary.
  std::string new_id;
  if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string for_build =
      this->Target->GetInstallNameDirForBuildTree(config);
    std::string for_install = this->Target->GetInstallNameDirForInstallTree(
      config, "${CMAKE_INSTALL_PREFIX}");

    if (this->Target->IsFrameworkOnApple() && for_install.empty()) {
      // Frameworks seem to have an id corresponding to their own full
      // path.
      // ...
      // for_install = fullDestPath_without_DESTDIR_or_name;
    }

    // If the install name will change on installation set the new id
    // on the installed file.
    if (for_build != for_install) {
      // Prepare to refer to the install-tree install_name.
      new_id = cmStrCat(
        for_install, this->GetInstallFilename(this->Target, config, NameSO));
    }
  }

  // Write a rule to run install_name_tool to set the install-tree
  // install_name value and references.
  if (!new_id.empty() || !install_name_remap.empty()) {
    os << indent << "execute_process(COMMAND \"" << installNameTool;
    os << "\"";
    if (!new_id.empty()) {
      os << "\n" << indent << "  -id \"" << new_id << "\"";
    }
    for (auto const& i : install_name_remap) {
      os << "\n"
         << indent << "  -change \"" << i.first << "\" \"" << i.second << "\"";
    }
    os << "\n" << indent << "  \"" << toDestDirPath << "\")\n";
  }
}